

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void bssl::ssl_session_renew_timeout(SSL *ssl,SSL_SESSION *session,uint32_t timeout)

{
  uint32_t timeout_local;
  SSL_SESSION *session_local;
  SSL *ssl_local;
  
  ssl_session_rebase_time(ssl,session);
  if ((session->timeout <= timeout) &&
     (session->timeout = timeout, session->auth_timeout < session->timeout)) {
    session->timeout = session->auth_timeout;
  }
  return;
}

Assistant:

void ssl_session_renew_timeout(SSL *ssl, SSL_SESSION *session,
                               uint32_t timeout) {
  // Rebase the timestamp relative to the current time so |timeout| is measured
  // correctly.
  ssl_session_rebase_time(ssl, session);

  if (session->timeout > timeout) {
    return;
  }

  session->timeout = timeout;
  if (session->timeout > session->auth_timeout) {
    session->timeout = session->auth_timeout;
  }
}